

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt_InitFont_internal(stbtt_fontinfo *info,uchar *data,int fontstart)

{
  uint uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  stbtt__buf cff_00;
  byte bVar4;
  stbtt_uint16 sVar5;
  stbtt_uint16 sVar6;
  stbtt_uint32 sVar7;
  stbtt_uint32 sVar8;
  bool bVar9;
  stbtt__buf sVar10;
  uchar *puStack_180;
  stbtt_uint32 encoding_record;
  undefined8 local_178;
  uchar *local_170;
  undefined8 local_168;
  uchar *local_160;
  undefined8 local_158;
  uchar *local_130;
  undefined8 local_128;
  uchar *local_120;
  undefined8 local_118;
  uchar *local_f0;
  uchar *local_e8;
  uchar *local_e0;
  uchar *local_d8;
  uchar *local_c0;
  undefined8 local_b8;
  uchar *local_b0;
  undefined8 local_a8;
  uchar *local_a0;
  undefined8 local_98;
  stbtt_uint32 local_88;
  stbtt_uint32 cff;
  stbtt_uint32 fdselectoff;
  stbtt_uint32 fdarrayoff;
  stbtt_uint32 charstrings;
  stbtt_uint32 cstype;
  stbtt__buf topdictidx;
  stbtt__buf topdict;
  stbtt__buf b;
  undefined8 local_40;
  int local_30;
  stbtt_int32 numTables;
  stbtt_int32 i;
  stbtt_uint32 t;
  stbtt_uint32 cmap;
  int fontstart_local;
  uchar *data_local;
  stbtt_fontinfo *info_local;
  
  info->data = data;
  info->fontstart = fontstart;
  sVar10 = stbtt__new_buf((void *)0x0,0);
  b._8_8_ = sVar10.data;
  (info->cff).data = (uchar *)b._8_8_;
  local_40 = sVar10._8_8_;
  (info->cff).cursor = (undefined4)local_40;
  (info->cff).size = local_40._4_4_;
  sVar7 = stbtt__find_table(data,fontstart,"cmap");
  sVar8 = stbtt__find_table(data,fontstart,"loca");
  info->loca = sVar8;
  sVar8 = stbtt__find_table(data,fontstart,"head");
  info->head = sVar8;
  sVar8 = stbtt__find_table(data,fontstart,"glyf");
  info->glyf = sVar8;
  sVar8 = stbtt__find_table(data,fontstart,"hhea");
  info->hhea = sVar8;
  sVar8 = stbtt__find_table(data,fontstart,"hmtx");
  info->hmtx = sVar8;
  sVar8 = stbtt__find_table(data,fontstart,"kern");
  info->kern = sVar8;
  sVar8 = stbtt__find_table(data,fontstart,"GPOS");
  info->gpos = sVar8;
  if ((((sVar7 == 0) || (info->head == 0)) || (info->hhea == 0)) || (info->hmtx == 0)) {
    return 0;
  }
  if (info->glyf == 0) {
    fdarrayoff = 2;
    fdselectoff = 0;
    cff = 0;
    local_88 = 0;
    sVar8 = stbtt__find_table(data,fontstart,"CFF ");
    if (sVar8 == 0) {
      return 0;
    }
    sVar10 = stbtt__new_buf((void *)0x0,0);
    local_a0 = sVar10.data;
    (info->fontdicts).data = local_a0;
    local_98 = sVar10._8_8_;
    (info->fontdicts).cursor = (undefined4)local_98;
    (info->fontdicts).size = local_98._4_4_;
    sVar10 = stbtt__new_buf((void *)0x0,0);
    local_b0 = sVar10.data;
    (info->fdselect).data = local_b0;
    local_a8 = sVar10._8_8_;
    (info->fdselect).cursor = (undefined4)local_a8;
    (info->fdselect).size = local_a8._4_4_;
    sVar10 = stbtt__new_buf(data + sVar8,0x20000000);
    local_c0 = sVar10.data;
    (info->cff).data = local_c0;
    local_b8 = sVar10._8_8_;
    (info->cff).cursor = (undefined4)local_b8;
    (info->cff).size = local_b8._4_4_;
    topdict._8_8_ = (info->cff).data;
    uVar2 = (info->cff).cursor;
    uVar3 = (info->cff).size;
    stbtt__buf_skip((stbtt__buf *)&topdict.cursor,2);
    bVar4 = stbtt__buf_get8((stbtt__buf *)&topdict.cursor);
    stbtt__buf_seek((stbtt__buf *)&topdict.cursor,(uint)bVar4);
    stbtt__cff_get_index((stbtt__buf *)&topdict.cursor);
    sVar10 = stbtt__cff_get_index((stbtt__buf *)&topdict.cursor);
    local_e0 = sVar10.data;
    _charstrings = local_e0;
    local_d8 = sVar10._8_8_;
    topdictidx.data = local_d8;
    sVar10 = stbtt__cff_index_get(sVar10,0);
    local_f0 = sVar10.data;
    topdictidx._8_8_ = local_f0;
    local_e8 = sVar10._8_8_;
    topdict.data = local_e8;
    stbtt__cff_get_index((stbtt__buf *)&topdict.cursor);
    sVar10 = stbtt__cff_get_index((stbtt__buf *)&topdict.cursor);
    local_120 = sVar10.data;
    (info->gsubrs).data = local_120;
    local_118 = sVar10._8_8_;
    (info->gsubrs).cursor = (undefined4)local_118;
    (info->gsubrs).size = local_118._4_4_;
    stbtt__dict_get_ints((stbtt__buf *)&topdictidx.cursor,0x11,1,&fdselectoff);
    stbtt__dict_get_ints((stbtt__buf *)&topdictidx.cursor,0x106,1,&fdarrayoff);
    stbtt__dict_get_ints((stbtt__buf *)&topdictidx.cursor,0x124,1,&cff);
    stbtt__dict_get_ints((stbtt__buf *)&topdictidx.cursor,0x125,1,&local_88);
    cff_00.cursor = uVar2;
    cff_00.size = uVar3;
    cff_00.data = (uchar *)topdict._8_8_;
    sVar10._8_8_ = topdict.data;
    sVar10.data = (uchar *)topdictidx._8_8_;
    sVar10 = stbtt__get_subrs(cff_00,sVar10);
    local_130 = sVar10.data;
    (info->subrs).data = local_130;
    local_128 = sVar10._8_8_;
    (info->subrs).cursor = (undefined4)local_128;
    (info->subrs).size = local_128._4_4_;
    if (fdarrayoff != 2) {
      return 0;
    }
    if (fdselectoff == 0) {
      return 0;
    }
    if (cff != 0) {
      if (local_88 == 0) {
        return 0;
      }
      stbtt__buf_seek((stbtt__buf *)&topdict.cursor,cff);
      sVar10 = stbtt__cff_get_index((stbtt__buf *)&topdict.cursor);
      local_160 = sVar10.data;
      (info->fontdicts).data = local_160;
      local_158 = sVar10._8_8_;
      (info->fontdicts).cursor = (undefined4)local_158;
      (info->fontdicts).size = local_158._4_4_;
      sVar10 = stbtt__buf_range((stbtt__buf *)&topdict.cursor,local_88,uVar3 - local_88);
      local_170 = sVar10.data;
      (info->fdselect).data = local_170;
      local_168 = sVar10._8_8_;
      (info->fdselect).cursor = (undefined4)local_168;
      (info->fdselect).size = local_168._4_4_;
    }
    stbtt__buf_seek((stbtt__buf *)&topdict.cursor,fdselectoff);
    sVar10 = stbtt__cff_get_index((stbtt__buf *)&topdict.cursor);
    puStack_180 = sVar10.data;
    (info->charstrings).data = puStack_180;
    local_178 = sVar10._8_8_;
    (info->charstrings).cursor = (undefined4)local_178;
    (info->charstrings).size = local_178._4_4_;
  }
  else if (info->loca == 0) {
    return 0;
  }
  sVar8 = stbtt__find_table(data,fontstart,"maxp");
  if (sVar8 == 0) {
    info->numGlyphs = 0xffff;
  }
  else {
    sVar5 = ttUSHORT(data + (ulong)sVar8 + 4);
    info->numGlyphs = (uint)sVar5;
  }
  sVar5 = ttUSHORT(data + (ulong)sVar7 + 2);
  info->index_map = 0;
  for (local_30 = 0; local_30 < (int)(uint)sVar5; local_30 = local_30 + 1) {
    uVar1 = sVar7 + 4 + local_30 * 8;
    sVar6 = ttUSHORT(data + uVar1);
    if (sVar6 == 0) {
      sVar8 = ttULONG(data + (ulong)uVar1 + 4);
      info->index_map = sVar7 + sVar8;
    }
    else if ((sVar6 == 3) &&
            ((sVar6 = ttUSHORT(data + (ulong)uVar1 + 2), sVar6 == 1 || (sVar6 == 10)))) {
      sVar8 = ttULONG(data + (ulong)uVar1 + 4);
      info->index_map = sVar7 + sVar8;
    }
  }
  bVar9 = info->index_map != 0;
  if (bVar9) {
    sVar5 = ttUSHORT(data + (long)info->head + 0x32);
    info->indexToLocFormat = (uint)sVar5;
  }
  info_local._4_4_ = (uint)bVar9;
  return info_local._4_4_;
}

Assistant:

static int stbtt_InitFont_internal(stbtt_fontinfo *info, unsigned char *data, int fontstart)
{
   stbtt_uint32 cmap, t;
   stbtt_int32 i,numTables;

   info->data = data;
   info->fontstart = fontstart;
   info->cff = stbtt__new_buf(NULL, 0);

   cmap = stbtt__find_table(data, fontstart, "cmap");       // required
   info->loca = stbtt__find_table(data, fontstart, "loca"); // required
   info->head = stbtt__find_table(data, fontstart, "head"); // required
   info->glyf = stbtt__find_table(data, fontstart, "glyf"); // required
   info->hhea = stbtt__find_table(data, fontstart, "hhea"); // required
   info->hmtx = stbtt__find_table(data, fontstart, "hmtx"); // required
   info->kern = stbtt__find_table(data, fontstart, "kern"); // not required
   info->gpos = stbtt__find_table(data, fontstart, "GPOS"); // not required

   if (!cmap || !info->head || !info->hhea || !info->hmtx)
      return 0;
   if (info->glyf) {
      // required for truetype
      if (!info->loca) return 0;
   } else {
      // initialization for CFF / Type2 fonts (OTF)
      stbtt__buf b, topdict, topdictidx;
      stbtt_uint32 cstype = 2, charstrings = 0, fdarrayoff = 0, fdselectoff = 0;
      stbtt_uint32 cff;

      cff = stbtt__find_table(data, fontstart, "CFF ");
      if (!cff) return 0;

      info->fontdicts = stbtt__new_buf(NULL, 0);
      info->fdselect = stbtt__new_buf(NULL, 0);

      // @TODO this should use size from table (not 512MB)
      info->cff = stbtt__new_buf(data+cff, 512*1024*1024);
      b = info->cff;

      // read the header
      stbtt__buf_skip(&b, 2);
      stbtt__buf_seek(&b, stbtt__buf_get8(&b)); // hdrsize

      // @TODO the name INDEX could list multiple fonts,
      // but we just use the first one.
      stbtt__cff_get_index(&b);  // name INDEX
      topdictidx = stbtt__cff_get_index(&b);
      topdict = stbtt__cff_index_get(topdictidx, 0);
      stbtt__cff_get_index(&b);  // string INDEX
      info->gsubrs = stbtt__cff_get_index(&b);

      stbtt__dict_get_ints(&topdict, 17, 1, &charstrings);
      stbtt__dict_get_ints(&topdict, 0x100 | 6, 1, &cstype);
      stbtt__dict_get_ints(&topdict, 0x100 | 36, 1, &fdarrayoff);
      stbtt__dict_get_ints(&topdict, 0x100 | 37, 1, &fdselectoff);
      info->subrs = stbtt__get_subrs(b, topdict);

      // we only support Type 2 charstrings
      if (cstype != 2) return 0;
      if (charstrings == 0) return 0;

      if (fdarrayoff) {
         // looks like a CID font
         if (!fdselectoff) return 0;
         stbtt__buf_seek(&b, fdarrayoff);
         info->fontdicts = stbtt__cff_get_index(&b);
         info->fdselect = stbtt__buf_range(&b, fdselectoff, b.size-fdselectoff);
      }

      stbtt__buf_seek(&b, charstrings);
      info->charstrings = stbtt__cff_get_index(&b);
   }

   t = stbtt__find_table(data, fontstart, "maxp");
   if (t)
      info->numGlyphs = ttUSHORT(data+t+4);
   else
      info->numGlyphs = 0xffff;

   // find a cmap encoding table we understand *now* to avoid searching
   // later. (todo: could make this installable)
   // the same regardless of glyph.
   numTables = ttUSHORT(data + cmap + 2);
   info->index_map = 0;
   for (i=0; i < numTables; ++i) {
      stbtt_uint32 encoding_record = cmap + 4 + 8 * i;
      // find an encoding we understand:
      switch(ttUSHORT(data+encoding_record)) {
         case STBTT_PLATFORM_ID_MICROSOFT:
            switch (ttUSHORT(data+encoding_record+2)) {
               case STBTT_MS_EID_UNICODE_BMP:
               case STBTT_MS_EID_UNICODE_FULL:
                  // MS/Unicode
                  info->index_map = cmap + ttULONG(data+encoding_record+4);
                  break;
            }
            break;
        case STBTT_PLATFORM_ID_UNICODE:
            // Mac/iOS has these
            // all the encodingIDs are unicode, so we don't bother to check it
            info->index_map = cmap + ttULONG(data+encoding_record+4);
            break;
      }
   }
   if (info->index_map == 0)
      return 0;

   info->indexToLocFormat = ttUSHORT(data+info->head + 50);
   return 1;
}